

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O0

CTX_PTR CreateSuccessors(CPpmd8 *p,Bool skip,CPpmd_State *s1,CTX_PTR c)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char local_f4;
  CTX_PTR local_f0;
  CTX_PTR c1;
  CPpmd_State *s_1;
  UInt32 s0;
  UInt32 cf;
  CPpmd_State *s;
  CPpmd_Void_Ref successor;
  uint numPs;
  CPpmd_State *ps [17];
  undefined1 auStack_36 [2];
  CPpmd_Byte_Ref upBranch;
  Byte flags;
  CTX_PTR pCStack_30;
  CPpmd_State upState;
  CTX_PTR c_local;
  CPpmd_State *s1_local;
  Bool skip_local;
  CPpmd8 *p_local;
  
  ps[0x10]._4_4_ = CONCAT22(p->FoundState->SuccessorHigh,p->FoundState->SuccessorLow);
  if (skip == 0) {
    _successor = p->FoundState;
  }
  s._4_4_ = (uint)(skip == 0);
  pCStack_30 = c;
  c_local = (CTX_PTR)s1;
  do {
    if (pCStack_30->Suffix == 0) {
LAB_00c3812a:
      auStack_36[0] = p->Base[ps[0x10]._4_4_];
      SetSuccessor((CPpmd_State *)auStack_36,ps[0x10]._4_4_ + 1);
      bVar1 = p->FoundState->Symbol;
      bVar2 = 0x3f < auStack_36[0];
      if (pCStack_30->NumStats == '\0') {
        auStack_36[1] = *(undefined1 *)((long)&pCStack_30->SummFreq + 1);
      }
      else {
        for (c1 = (CTX_PTR)(p->Base + pCStack_30->Stats); c1->NumStats != auStack_36[0];
            c1 = (CTX_PTR)((long)&c1->Stats + 2)) {
        }
        iVar3 = c1->Flags - 1;
        uVar4 = ((uint)pCStack_30->SummFreq - (uint)pCStack_30->NumStats) - iVar3;
        if (uVar4 < (uint)(iVar3 * 2)) {
          local_f4 = (char)(((iVar3 + uVar4 * 2) - 3) / uVar4);
        }
        else {
          local_f4 = uVar4 < (uint)(iVar3 * 5);
        }
        auStack_36[1] = local_f4 + '\x01';
      }
      do {
        if (p->HiUnit == p->LoUnit) {
          if (p->FreeList[0] == 0) {
            local_f0 = (CTX_PTR)AllocUnitsRare(p,0);
            if (local_f0 == (CTX_PTR)0x0) {
              return (CTX_PTR)0x0;
            }
          }
          else {
            local_f0 = (CTX_PTR)RemoveNode(p,0);
          }
        }
        else {
          local_f0 = (CTX_PTR)(p->HiUnit + -0xc);
          p->HiUnit = (Byte *)local_f0;
        }
        local_f0->NumStats = '\0';
        local_f0->Flags = (0x3f < bVar1) * '\x10' + bVar2 * '\b';
        *(undefined4 *)&local_f0->SummFreq = _auStack_36;
        *(undefined2 *)((long)&local_f0->Stats + 2) = upBranch._2_2_;
        local_f0->Suffix = (int)pCStack_30 - (int)p->Base;
        s._4_4_ = s._4_4_ - 1;
        SetSuccessor(*(CPpmd_State **)(&successor + (ulong)s._4_4_ * 2),(int)local_f0 - (int)p->Base
                    );
        pCStack_30 = local_f0;
      } while (s._4_4_ != 0);
      return local_f0;
    }
    pCStack_30 = (CTX_PTR)(p->Base + pCStack_30->Suffix);
    if (c_local == (CTX_PTR)0x0) {
      if (pCStack_30->NumStats == '\0') {
        _s0 = (CTX_PTR)&pCStack_30->SummFreq;
        *(byte *)((long)&pCStack_30->SummFreq + 1) =
             *(undefined1 *)((long)&pCStack_30->SummFreq + 1) +
             ((p->Base[pCStack_30->Suffix] != '\0' ^ 0xffU) & 1 &
             (byte)*(undefined1 *)((long)&pCStack_30->SummFreq + 1) < 0x18);
      }
      else {
        for (_s0 = (CTX_PTR)(p->Base + pCStack_30->Stats);
            (Byte)*(CPpmd8_Context_Ref *)&_s0->NumStats != p->FoundState->Symbol;
            _s0 = (CTX_PTR)((long)&_s0->Stats + 2)) {
        }
        if (_s0->Flags < 0x73) {
          _s0->Flags = _s0->Flags + '\x01';
          pCStack_30->SummFreq = pCStack_30->SummFreq + 1;
        }
      }
    }
    else {
      _s0 = c_local;
      c_local = (CTX_PTR)0x0;
    }
    if (*(uint *)&_s0->SummFreq != ps[0x10]._4_4_) {
      pCStack_30 = (CTX_PTR)(p->Base + *(uint *)&_s0->SummFreq);
      if (s._4_4_ == 0) {
        return pCStack_30;
      }
      goto LAB_00c3812a;
    }
    *(CTX_PTR *)(&successor + (ulong)s._4_4_ * 2) = _s0;
    s._4_4_ = s._4_4_ + 1;
  } while( true );
}

Assistant:

static CTX_PTR CreateSuccessors(CPpmd8 *p, Bool skip, CPpmd_State *s1, CTX_PTR c)
{
  CPpmd_State upState;
  Byte flags;
  CPpmd_Byte_Ref upBranch = (CPpmd_Byte_Ref)SUCCESSOR(p->FoundState);
  /* fixed over Shkarin's code. Maybe it could work without + 1 too. */
  CPpmd_State *ps[PPMD8_MAX_ORDER + 1];
  unsigned numPs = 0;

#ifdef __clang_analyzer__
  memset(ps, 0, sizeof(ps));
#endif

  
  if (!skip)
    ps[numPs++] = p->FoundState;
  
  while (c->Suffix)
  {
    CPpmd_Void_Ref successor;
    CPpmd_State *s;
    c = SUFFIX(c);
    if (s1)
    {
      s = s1;
      s1 = NULL;
    }
    else if (c->NumStats != 0)
    {
      for (s = STATS(c); s->Symbol != p->FoundState->Symbol; s++);
      if (s->Freq < MAX_FREQ - 9)
      {
        s->Freq++;
        c->SummFreq++;
      }
    }
    else
    {
      s = ONE_STATE(c);
      s->Freq = (Byte)(s->Freq + (!SUFFIX(c)->NumStats & (s->Freq < 24)));
    }
    successor = SUCCESSOR(s);
    if (successor != upBranch)
    {
      c = CTX(successor);
      if (numPs == 0)
        return c;
      break;
    }
    ps[numPs++] = s;
  }
  
  upState.Symbol = *(const Byte *)Ppmd8_GetPtr(p, upBranch);
  SetSuccessor(&upState, upBranch + 1);
  flags = (Byte)(0x10 * (p->FoundState->Symbol >= 0x40) + 0x08 * (upState.Symbol >= 0x40));

  if (c->NumStats == 0)
    upState.Freq = ONE_STATE(c)->Freq;
  else
  {
    UInt32 cf, s0;
    CPpmd_State *s;
    for (s = STATS(c); s->Symbol != upState.Symbol; s++);
    cf = s->Freq - 1;
    s0 = c->SummFreq - c->NumStats - cf;
    upState.Freq = (Byte)(1 + ((2 * cf <= s0) ? (5 * cf > s0) : ((cf + 2 * s0 - 3) / s0)));
  }

  do
  {
    /* Create Child */
    CTX_PTR c1; /* = AllocContext(p); */
    if (p->HiUnit != p->LoUnit)
      c1 = (CTX_PTR)(p->HiUnit -= UNIT_SIZE);
    else if (p->FreeList[0] != 0)
      c1 = (CTX_PTR)RemoveNode(p, 0);
    else
    {
      c1 = (CTX_PTR)AllocUnitsRare(p, 0);
      if (!c1)
        return NULL;
    }
    c1->NumStats = 0;
    c1->Flags = flags;
    *ONE_STATE(c1) = upState;
    c1->Suffix = REF(c);
    SetSuccessor(ps[--numPs], REF(c1));
    c = c1;
  }
  while (numPs != 0);
  
  return c;
}